

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_align_quad(REF_GRID ref_grid)

{
  REF_MIGRATE_PARTIONER RVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_GEOM pRVar4;
  REF_CLOUD pRVar5;
  uint uVar6;
  REF_ADJ_ITEM pRVar7;
  ulong uVar8;
  long lVar9;
  REF_CELL pRVar10;
  undefined8 uVar11;
  ulong uVar12;
  char *pcVar13;
  REF_INT RVar14;
  long lVar15;
  REF_CELL pRVar16;
  REF_NODE pRVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  REF_DBL RStack_1b0;
  REF_INT id;
  REF_INT closest_node;
  REF_CAVITY local_198;
  REF_INT new_node;
  REF_DBL xyz_1 [3];
  REF_DBL xyz [3];
  REF_INT id_1;
  REF_CELL local_140;
  REF_GEOM local_138;
  REF_CLOUD local_130;
  REF_GEOM local_128;
  REF_LIST previous_list;
  REF_CLOUD previous_cloud;
  REF_DBL dist;
  REF_CLOUD local_108;
  REF_CLOUD next_cloud;
  REF_GLOB global;
  REF_MIGRATE_PARTIONER local_ec;
  REF_LIST local_e8;
  REF_NODE local_e0;
  REF_DBL d [12];
  REF_DBL uv [2];
  REF_DBL m [6];
  
  RVar1 = ref_grid->partitioner;
  ref_grid->partitioner = REF_MIGRATE_SINGLE;
  uVar6 = ref_migrate_to_balance(ref_grid);
  if (uVar6 == 0) {
    uVar6 = ref_cloud_create(&previous_cloud,3);
    if (uVar6 == 0) {
      uVar6 = ref_list_create(&previous_list);
      if (uVar6 == 0) {
        local_130 = previous_cloud;
        local_138 = (REF_GEOM)previous_list;
        pRVar17 = ref_grid->node;
        pRVar10 = ref_grid->cell[0];
        local_128 = ref_grid->geom;
        local_140 = pRVar10;
        local_ec = RVar1;
        for (lVar15 = 0; lVar15 < pRVar17->max; lVar15 = lVar15 + 1) {
          if (((-1 < pRVar17->global[lVar15]) && (lVar15 < pRVar10->ref_adj->nnode)) &&
             (pRVar10->ref_adj->first[lVar15] != -1)) {
            pRVar10 = ref_grid->cell[0];
            xyz_1[0] = 0.0;
            xyz_1[1] = 0.0;
            xyz_1[2] = 0.0;
            pRVar2 = pRVar10->ref_adj;
            RVar14 = -1;
            iVar18 = -1;
            if (pRVar2->nnode <= lVar15) goto LAB_001e4a2c;
            iVar19 = pRVar2->first[lVar15];
            RVar14 = -1;
            iVar18 = -1;
            if (iVar19 == -1) goto LAB_001e4a2c;
            pRVar7 = pRVar2->item;
            do {
              RVar14 = pRVar7[iVar19].ref;
              iVar18 = iVar19;
LAB_001e4a2c:
              do {
                if (iVar18 == -1) {
                  uVar6 = ref_math_normalize(xyz_1);
                  if (uVar6 != 0) {
                    pcVar13 = "norm";
                    uVar11 = 0x214;
                    goto LAB_001e4da7;
                  }
                  RVar14 = (REF_INT)lVar15;
                  uVar6 = ref_node_metric_get(pRVar17,RVar14,m);
                  if (uVar6 == 0) {
                    uVar6 = ref_matrix_diag_m(m,d);
                    if (uVar6 != 0) {
                      pcVar13 = "eigen decomp";
                      uVar11 = 0x228;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_matrix_descending_eig_twod(d);
                    pRVar4 = local_128;
                    if (uVar6 != 0) {
                      pcVar13 = "2D eig sort";
                      uVar11 = 0x229;
                      goto LAB_001e4dd2;
                    }
                    dVar20 = xyz_1[2] * d[5] + xyz_1[0] * d[3] + xyz_1[1] * d[4];
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    pRVar10 = local_140;
                    if (dVar20 <= 0.9848) goto LAB_001e4d7c;
                    if (d[0] < 0.0) {
                      dVar20 = sqrt(d[0]);
                    }
                    else {
                      dVar20 = SQRT(d[0]);
                    }
                    dVar20 = 1.0 / dVar20;
                    pRVar3 = pRVar17->real;
                    xyz[0] = xyz_1[0] * dVar20 + pRVar3[lVar15 * 0xf];
                    xyz[1] = xyz_1[1] * dVar20 + pRVar3[lVar15 * 0xf + 1];
                    xyz[2] = dVar20 * xyz_1[2] + pRVar3[lVar15 * 0xf + 2];
                    uVar6 = ref_node_nearest_xyz(pRVar17,xyz,&closest_node,&dist);
                    if (uVar6 != 0) {
                      pcVar13 = "close";
                      uVar11 = 0x237;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_node_next_global(pRVar17,&global);
                    if (uVar6 != 0) {
                      pcVar13 = "global";
                      uVar11 = 0x238;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_cloud_push(local_130,global,xyz_1);
                    if (uVar6 != 0) {
                      pcVar13 = "store cloud";
                      uVar11 = 0x239;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_list_push((REF_LIST)local_138,RVar14);
                    if (uVar6 != 0) {
                      pcVar13 = "store list";
                      uVar11 = 0x23a;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_node_add(pRVar17,global,&new_node);
                    if (uVar6 != 0) {
                      pcVar13 = "add";
                      uVar11 = 0x23b;
                      goto LAB_001e4dd2;
                    }
                    pRVar3 = pRVar17->real;
                    lVar9 = (long)new_node;
                    pRVar3[lVar9 * 0xf] = xyz[0];
                    pRVar3[lVar9 * 0xf + 1] = xyz[1];
                    pRVar3[lVar9 * 0xf + 2] = xyz[2];
                    uVar6 = ref_geom_unique_id(pRVar4,RVar14,2,&id);
                    if (uVar6 != 0) {
                      pcVar13 = "unique face id";
                      uVar11 = 0x240;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_geom_tuv(pRVar4,RVar14,2,id,uv);
                    if (uVar6 != 0) {
                      pcVar13 = "uv";
                      uVar11 = 0x241;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_egads_inverse_eval(pRVar4,2,id,xyz,uv);
                    if (uVar6 != 0) {
                      pcVar13 = "inverse uv";
                      uVar11 = 0x242;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_geom_add(pRVar4,new_node,2,id,uv);
                    if (uVar6 != 0) {
                      pcVar13 = "new geom";
                      uVar11 = 0x243;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_metric_interpolate_between(ref_grid,RVar14,-1,new_node);
                    if (uVar6 != 0) {
                      pcVar13 = "metric interp";
                      uVar11 = 0x245;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_cavity_create(&local_198);
                    if (uVar6 != 0) {
                      pcVar13 = "cav create";
                      uVar11 = 0x246;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_cavity_form_insert(local_198,ref_grid,new_node,RVar14,-1,-1);
                    if (uVar6 != 0) {
                      pcVar13 = "ball";
                      uVar11 = 0x249;
                      goto LAB_001e4dd2;
                    }
                    uVar6 = ref_cavity_enlarge_conforming(local_198);
                    if (uVar6 == 0) {
                      uVar6 = ref_cavity_replace(local_198);
                      if (uVar6 == 0) {
                        uVar6 = ref_cavity_free(local_198);
                        pRVar10 = local_140;
                        if (uVar6 != 0) {
                          pcVar13 = "cav free";
                          uVar11 = 0x255;
                          goto LAB_001e4dd2;
                        }
                        goto LAB_001e4d7c;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x254,"ref_layer_align_first_layer",(ulong)uVar6,"cav replace");
                      ref_cavity_tec(local_198,"ref_layer_align_quad_cavity.tec");
                      ref_export_by_extension(ref_grid,"ref_layer_align_quad_mesh.tec");
                      printf("norm %f %f %f dir %f %f %f dot %f\n");
                      printf("new %f %f %f\n",xyz[0],xyz[1],xyz[2]);
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x24d,"ref_layer_align_first_layer",(ulong)uVar6,"enlarge");
                      ref_cavity_tec(local_198,"cav-fail.tec");
                      ref_export_by_extension(ref_grid,"mesh-fail.tec");
                    }
                  }
                  else {
                    pcVar13 = "get";
                    uVar11 = 0x227;
LAB_001e4dd2:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,uVar11,"ref_layer_align_first_layer",(ulong)uVar6,pcVar13);
                  }
                  pcVar13 = "first layer";
                  uVar11 = 0x2b3;
                  goto LAB_001e4dfd;
                }
                uVar6 = ref_layer_interior_seg_normal(ref_grid,RVar14,xyz);
                if (uVar6 != 0) {
                  pcVar13 = "normal";
                  uVar11 = 0x20f;
LAB_001e4da7:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,uVar11,"ref_layer_twod_normal",(ulong)uVar6,pcVar13);
                  pcVar13 = "twod normal";
                  uVar11 = 0x226;
                  goto LAB_001e4dd2;
                }
                xyz_1[0] = xyz[0] + xyz_1[0];
                xyz_1[1] = xyz[1] + xyz_1[1];
                xyz_1[2] = xyz[2] + xyz_1[2];
                pRVar7 = pRVar10->ref_adj->item;
                iVar19 = pRVar7[iVar18].next;
                RVar14 = -1;
                iVar18 = iVar19;
              } while (iVar19 == -1);
            } while( true );
          }
LAB_001e4d7c:
        }
        uVar6 = ref_layer_quad_right_triangles(ref_grid);
        if (uVar6 == 0) {
          uVar6 = ref_cloud_create(&next_cloud,3);
          if (uVar6 == 0) {
            uVar6 = ref_list_create((REF_LIST *)&local_108);
            pRVar5 = previous_cloud;
            if (uVar6 == 0) {
              iVar18 = previous_cloud->n;
              RStack_1b0 = -NAN;
              if (0 < iVar18) {
                RStack_1b0 = (REF_DBL)*previous_cloud->global;
              }
              local_e8 = previous_list;
              local_128 = (REF_GEOM)next_cloud;
              local_130 = local_108;
              pRVar17 = ref_grid->node;
              local_138 = ref_grid->geom;
              pRVar10 = (REF_CELL)0x0;
              local_e0 = pRVar17;
              while (dist = RStack_1b0, (long)pRVar10 < (long)iVar18) {
                uVar6 = ref_node_local(pRVar17,(REF_GLOB)RStack_1b0,&closest_node);
                if (uVar6 != 0) {
                  pcVar13 = "local";
                  uVar11 = 0x26c;
LAB_001e5bd5:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,uVar11,"ref_layer_align_quad_advance",(ulong)uVar6,pcVar13);
LAB_001e5bdf:
                  pcVar13 = "first layer";
                  uVar11 = 0x2ba;
                  goto LAB_001e4dfd;
                }
                uVar6 = pRVar5->naux;
                uVar8 = 0;
                if (0 < (int)uVar6) {
                  uVar8 = (ulong)uVar6;
                }
                for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
                  xyz[uVar12] = pRVar5->aux[(long)(int)((int)pRVar10 * uVar6) + uVar12];
                }
                uVar6 = ref_node_metric_get(pRVar17,closest_node,m);
                if (uVar6 != 0) {
                  pcVar13 = "get";
                  uVar11 = 0x270;
                  goto LAB_001e5bd5;
                }
                uVar6 = ref_matrix_diag_m(m,d);
                if (uVar6 != 0) {
                  pcVar13 = "eigen decomp";
                  uVar11 = 0x271;
                  goto LAB_001e5bd5;
                }
                uVar6 = ref_matrix_descending_eig_twod(d);
                if (uVar6 != 0) {
                  pcVar13 = "2D eig sort";
                  uVar11 = 0x272;
                  goto LAB_001e5bd5;
                }
                dVar20 = xyz[2] * d[5] + xyz[0] * d[3] + xyz[1] * d[4];
                if (dVar20 <= -dVar20) {
                  dVar20 = -dVar20;
                }
                pRVar16 = pRVar10;
                if (0.9848 < dVar20) {
                  if (d[0] < 0.0) {
                    dVar20 = sqrt(d[0]);
                  }
                  else {
                    dVar20 = SQRT(d[0]);
                  }
                  dVar20 = 1.0 / dVar20;
                  pRVar3 = pRVar17->real;
                  lVar15 = (long)closest_node;
                  xyz_1[0] = xyz[0] * dVar20 + pRVar3[lVar15 * 0xf];
                  xyz_1[1] = xyz[1] * dVar20 + pRVar3[lVar15 * 0xf + 1];
                  xyz_1[2] = dVar20 * xyz[2] + pRVar3[lVar15 * 0xf + 2];
                  uVar6 = ref_node_nearest_xyz(pRVar17,xyz_1,&new_node,(REF_DBL *)&global);
                  if (uVar6 != 0) {
                    pcVar13 = "close";
                    uVar11 = 0x27f;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_node_next_global(pRVar17,(REF_GLOB *)&dist);
                  if (uVar6 != 0) {
                    pcVar13 = "global";
                    uVar11 = 0x280;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_cloud_store((REF_CLOUD)local_128,(REF_GLOB)dist,xyz);
                  if (uVar6 != 0) {
                    pcVar13 = "store cloud";
                    uVar11 = 0x281;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_list_push((REF_LIST)local_130,closest_node);
                  if (uVar6 != 0) {
                    pcVar13 = "store list";
                    uVar11 = 0x282;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_node_add(pRVar17,(REF_GLOB)dist,&id);
                  pRVar4 = local_138;
                  if (uVar6 != 0) {
                    pcVar13 = "add";
                    uVar11 = 0x283;
                    goto LAB_001e5bd5;
                  }
                  pRVar3 = pRVar17->real;
                  lVar15 = (long)id;
                  pRVar3[lVar15 * 0xf] = xyz_1[0];
                  pRVar3[lVar15 * 0xf + 1] = xyz_1[1];
                  pRVar3[lVar15 * 0xf + 2] = xyz_1[2];
                  local_140 = pRVar10;
                  uVar6 = ref_geom_unique_id(local_138,closest_node,2,&id_1);
                  if (uVar6 != 0) {
                    pcVar13 = "unique face id";
                    uVar11 = 0x288;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_geom_tuv(pRVar4,closest_node,2,id_1,uv);
                  if (uVar6 != 0) {
                    pcVar13 = "uv";
                    uVar11 = 0x289;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_egads_inverse_eval(pRVar4,2,id_1,xyz_1,uv);
                  if (uVar6 != 0) {
                    pcVar13 = "inverse uv";
                    uVar11 = 0x28a;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_geom_add(pRVar4,id,2,id_1,uv);
                  if (uVar6 != 0) {
                    pcVar13 = "new geom";
                    uVar11 = 0x28b;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_metric_interpolate_between(ref_grid,closest_node,-1,id);
                  pRVar17 = local_e0;
                  if (uVar6 != 0) {
                    pcVar13 = "metric interp";
                    uVar11 = 0x28d;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_cavity_create(&local_198);
                  if (uVar6 != 0) {
                    pcVar13 = "cav create";
                    uVar11 = 0x28e;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_cavity_form_insert
                                    (local_198,ref_grid,id,closest_node,
                                     local_e8->value[(long)local_140],-1);
                  if (uVar6 != 0) {
                    pcVar13 = "ball";
                    uVar11 = 0x291;
                    goto LAB_001e5bd5;
                  }
                  uVar6 = ref_cavity_enlarge_conforming(local_198);
                  pRVar16 = local_140;
                  if (uVar6 == 0) {
                    if (local_198->state == REF_CAVITY_VISIBLE) {
                      uVar6 = ref_cavity_replace(local_198);
                      if (uVar6 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x29d,"ref_layer_align_quad_advance",(ulong)uVar6,"cav replace");
                        ref_cavity_tec(local_198,"ref_layer_align_quad_cavity.tec");
                        ref_export_by_extension(ref_grid,"ref_layer_align_quad_mesh.tec");
                        printf("norm %f %f %f dir %f %f %f dot %f\n");
                        printf("new %f %f %f\n",xyz_1[0],xyz_1[1],xyz_1[2]);
                        goto LAB_001e5bdf;
                      }
LAB_001e538c:
                      uVar6 = ref_cavity_free(local_198);
                      if (uVar6 == 0) goto LAB_001e539e;
                      pcVar13 = "cav free";
                      uVar11 = 0x2a4;
                    }
                    else {
                      uVar6 = ref_node_remove(pRVar17,id);
                      if (uVar6 == 0) {
                        uVar6 = ref_geom_remove_all(local_138,id);
                        if (uVar6 == 0) {
                          local_128->n = local_128->n + -1;
                          local_130->n = local_130->n + -1;
                          goto LAB_001e538c;
                        }
                        pcVar13 = "rm";
                        uVar11 = 0x2a0;
                      }
                      else {
                        pcVar13 = "rm";
                        uVar11 = 0x29f;
                      }
                    }
                    goto LAB_001e5bd5;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x295,"ref_layer_align_quad_advance",(ulong)uVar6,"enlarge");
                  ref_cavity_tec(local_198,"cav-fail.tec");
                  ref_export_by_extension(ref_grid,"mesh-fail.tec");
                  goto LAB_001e5bdf;
                }
LAB_001e539e:
                pRVar10 = (REF_CELL)((long)&pRVar16->type + 1);
                iVar18 = pRVar5->n;
                RStack_1b0 = -NAN;
                if ((int)pRVar10 < iVar18) {
                  RStack_1b0 = (REF_DBL)pRVar5->global[(long)((long)&pRVar16->type + 1)];
                }
              }
              uVar6 = ref_cloud_free(previous_cloud);
              if (uVar6 == 0) {
                uVar6 = ref_list_free(previous_list);
                pRVar5 = next_cloud;
                if (uVar6 == 0) {
                  previous_cloud = next_cloud;
                  next_cloud = (REF_CLOUD)0x0;
                  previous_list = (REF_LIST)local_108;
                  local_108 = (REF_CLOUD)0x0;
                  uVar6 = ref_cloud_free(pRVar5);
                  if (uVar6 == 0) {
                    uVar6 = ref_layer_quad_right_triangles(ref_grid);
                    if (uVar6 == 0) {
                      ref_grid->partitioner = local_ec;
                      uVar6 = ref_migrate_to_balance(ref_grid);
                      if (uVar6 == 0) {
                        return 0;
                      }
                      pcVar13 = "migrate to single part";
                      uVar11 = 0x2d1;
                      goto LAB_001e4e28;
                    }
                    pcVar13 = "tri2qaud";
                    uVar11 = 0x2c5;
                  }
                  else {
                    pcVar13 = "free next cloud";
                    uVar11 = 0x2c3;
                  }
                }
                else {
                  pcVar13 = "free previous list";
                  uVar11 = 700;
                }
              }
              else {
                pcVar13 = "free previous cloud";
                uVar11 = 699;
              }
            }
            else {
              pcVar13 = "next list";
              uVar11 = 0x2b7;
            }
          }
          else {
            pcVar13 = "next cloud";
            uVar11 = 0x2b6;
          }
        }
        else {
          pcVar13 = "tri2qaud";
          uVar11 = 0x2b5;
        }
      }
      else {
        pcVar13 = "previous list";
        uVar11 = 0x2b0;
      }
    }
    else {
      pcVar13 = "previous cloud";
      uVar11 = 0x2af;
    }
LAB_001e4dfd:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar11,
           "ref_layer_align_quad_seq",(ulong)uVar6,pcVar13);
    pcVar13 = "quad";
    uVar11 = 0x2cf;
  }
  else {
    pcVar13 = "migrate to single part";
    uVar11 = 0x2ce;
  }
LAB_001e4e28:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar11,
         "ref_layer_align_quad",(ulong)uVar6,pcVar13);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_quad(REF_GRID ref_grid) {
  REF_MIGRATE_PARTIONER previous;
  previous = ref_grid_partitioner(ref_grid);
  ref_grid_partitioner(ref_grid) = REF_MIGRATE_SINGLE;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_layer_align_quad_seq(ref_grid), "quad");
  ref_grid_partitioner(ref_grid) = previous;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  return REF_SUCCESS;
}